

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::NConnectShapeF
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,int connect,int order)

{
  long in_RDI;
  int in_stack_0000000c;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x118) == 0) {
    local_4 = TPZShapeHCurl<pzshape::TPZShapeCube>::ComputeNConnectShapeF(order,in_stack_0000000c);
  }
  else if (*(int *)(in_RDI + 0x118) == 1) {
    local_4 = TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::ComputeNConnectShapeF
                        (order,in_stack_0000000c);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int TPZCompElHCurl<TSHAPE>::NConnectShapeF(int connect, int order) const
{
    switch (fhcurlfam)
    {
    case HCurlFamily::EHCurlStandard:
        return TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(connect, order);
        break;
    case HCurlFamily::EHCurlNoGrads:
        return TPZShapeHCurlNoGrads<TSHAPE>::ComputeNConnectShapeF(connect, order);
        break;
    }/**there is no default case on purpose, because now the compiler
      will warn us if a new hcurl family is added*/
    return -1;
}